

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceFile.cxx
# Opt level: O3

bool __thiscall cmSourceFile::FindFullPath(cmSourceFile *this,string *error)

{
  cmMakefile *this_00;
  undefined8 *puVar1;
  ulong *puVar2;
  bool bVar3;
  cmake *pcVar4;
  string *psVar5;
  bool bVar6;
  long lVar7;
  string *ext;
  ulong *puVar8;
  string err;
  string lPath;
  anon_class_24_3_964a6fe1 findInDir;
  array<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_2UL>
  extsLists;
  string local_a8;
  string local_88;
  cmMakefile *local_68;
  string *local_60;
  anon_class_24_3_964a6fe1 local_58;
  array<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_2UL>
  local_40;
  
  if (this->IsGenerated == true) {
    cmSourceFileLocation::DirectoryUseBinary(&this->Location);
    cmSourceFileLocation::GetFullPath_abi_cxx11_(&local_88,&this->Location);
    std::__cxx11::string::operator=((string *)&this->FullPath,(string *)&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    return true;
  }
  if (this->FindFullPathFailed != false) {
    return false;
  }
  this_00 = (this->Location).Makefile;
  cmSourceFileLocation::GetFullPath_abi_cxx11_(&local_88,&this->Location);
  pcVar4 = cmMakefile::GetCMakeInstance(this_00);
  local_40._M_elems[0] = &pcVar4->SourceFileExtensions;
  pcVar4 = cmMakefile::GetCMakeInstance(this_00);
  local_40._M_elems[1] = &pcVar4->HeaderFileExtensions;
  local_58.extsLists = &local_40;
  local_58.this = this;
  local_58.lPath = &local_88;
  if ((this->Location).AmbiguousDirectory == true) {
    psVar5 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(this_00);
    bVar3 = FindFullPath::anon_class_24_3_964a6fe1::operator()(&local_58,psVar5);
    bVar6 = true;
    if (bVar3) goto LAB_00196a4f;
    psVar5 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(this_00);
    bVar3 = FindFullPath::anon_class_24_3_964a6fe1::operator()(&local_58,psVar5);
  }
  else {
    local_a8._M_string_length = 0;
    local_a8.field_2._M_local_buf[0] = '\0';
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    bVar3 = FindFullPath::anon_class_24_3_964a6fe1::operator()(&local_58,&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,
                      CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                               local_a8.field_2._M_local_buf[0]) + 1);
    }
  }
  bVar6 = true;
  if (!bVar3) {
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    local_a8._M_string_length = 0;
    local_a8.field_2._M_local_buf[0] = '\0';
    local_68 = this_00;
    local_60 = error;
    std::__cxx11::string::append((char *)&local_a8);
    std::__cxx11::string::_M_append((char *)&local_a8,(ulong)local_88._M_dataplus._M_p);
    std::__cxx11::string::append((char *)&local_a8);
    lVar7 = 0;
    do {
      puVar1 = *(undefined8 **)((long)local_40._M_elems + lVar7);
      puVar2 = (ulong *)puVar1[1];
      for (puVar8 = (ulong *)*puVar1; puVar8 != puVar2; puVar8 = puVar8 + 4) {
        std::__cxx11::string::append((char *)&local_a8);
        std::__cxx11::string::_M_append((char *)&local_a8,*puVar8);
      }
      lVar7 = lVar7 + 8;
    } while (lVar7 != 0x10);
    if (local_60 == (string *)0x0) {
      cmMakefile::IssueMessage(local_68,FATAL_ERROR,&local_a8);
    }
    else {
      std::__cxx11::string::operator=((string *)local_60,(string *)&local_a8);
    }
    this->FindFullPathFailed = true;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,
                      CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                               local_a8.field_2._M_local_buf[0]) + 1);
    }
    bVar6 = false;
  }
LAB_00196a4f:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  return bVar6;
}

Assistant:

bool cmSourceFile::FindFullPath(std::string* error)
{
  // If the file is generated compute the location without checking on disk.
  if (this->GetIsGenerated()) {
    // The file is either already a full path or is relative to the
    // build directory for the target.
    this->Location.DirectoryUseBinary();
    this->FullPath = this->Location.GetFullPath();
    return true;
  }

  // If this method has already failed once do not try again.
  if (this->FindFullPathFailed) {
    return false;
  }

  // The file is not generated.  It must exist on disk.
  cmMakefile const* makefile = this->Location.GetMakefile();
  // Location path
  std::string const lPath = this->Location.GetFullPath();
  // List of extension lists
  std::array<std::vector<std::string> const*, 2> const extsLists = {
    { &makefile->GetCMakeInstance()->GetSourceExtensions(),
      &makefile->GetCMakeInstance()->GetHeaderExtensions() }
  };

  // Tries to find the file in a given directory
  auto findInDir = [this, &extsLists, &lPath](std::string const& dir) -> bool {
    // Compute full path
    std::string const fullPath = cmSystemTools::CollapseFullPath(lPath, dir);
    // Try full path
    if (cmSystemTools::FileExists(fullPath)) {
      this->FullPath = fullPath;
      return true;
    }
    // Try full path with extension
    for (auto exts : extsLists) {
      for (std::string const& ext : *exts) {
        if (!ext.empty()) {
          std::string extPath = fullPath;
          extPath += '.';
          extPath += ext;
          if (cmSystemTools::FileExists(extPath)) {
            this->FullPath = extPath;
            return true;
          }
        }
      }
    }
    // File not found
    return false;
  };

  // Try to find the file in various directories
  if (this->Location.DirectoryIsAmbiguous()) {
    if (findInDir(makefile->GetCurrentSourceDirectory()) ||
        findInDir(makefile->GetCurrentBinaryDirectory())) {
      return true;
    }
  } else {
    if (findInDir({})) {
      return true;
    }
  }

  // Compose error
  std::string err;
  err += "Cannot find source file:\n  ";
  err += lPath;
  err += "\nTried extensions";
  for (auto exts : extsLists) {
    for (std::string const& ext : *exts) {
      err += " .";
      err += ext;
    }
  }
  if (error != nullptr) {
    *error = std::move(err);
  } else {
    makefile->IssueMessage(MessageType::FATAL_ERROR, err);
  }
  this->FindFullPathFailed = true;

  // File not found
  return false;
}